

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

void __thiscall QAuthenticator::setUser(QAuthenticator *this,QString *user)

{
  bool bVar1;
  QString *in_RSI;
  QString *in_RDI;
  
  if (((in_RDI->d).d == (Data *)0x0) || (bVar1 = ::operator!=(in_RSI,in_RDI), bVar1)) {
    detach((QAuthenticator *)in_RSI);
    QString::operator=((QString *)(in_RDI->d).d,(QString *)in_RSI);
    QAuthenticatorPrivate::updateCredentials((QAuthenticatorPrivate *)user);
  }
  return;
}

Assistant:

void QAuthenticator::setUser(const QString &user)
{
    if (!d || d->user != user) {
        detach();
        d->user = user;
        d->updateCredentials();
    }
}